

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==(SupportVectorRegressor *a,SupportVectorRegressor *b)

{
  bool bVar1;
  DenseSupportVectors *pDVar2;
  DenseSupportVectors *pDVar3;
  SparseSupportVectors *pSVar4;
  SparseSupportVectors *pSVar5;
  Kernel *b_00;
  Coefficients *b_01;
  Kernel *a_00;
  Coefficients *a_01;
  
  a_00 = a->kernel_;
  if (a_00 == (Kernel *)0x0) {
    a_00 = (Kernel *)&_Kernel_default_instance_;
  }
  b_00 = b->kernel_;
  if (b_00 == (Kernel *)0x0) {
    b_00 = (Kernel *)&_Kernel_default_instance_;
  }
  bVar1 = operator!=(a_00,b_00);
  if ((!bVar1) && (a->_oneof_case_[0] == b->_oneof_case_[0])) {
    a_01 = a->coefficients_;
    if (a_01 == (Coefficients *)0x0) {
      a_01 = (Coefficients *)&_Coefficients_default_instance_;
    }
    b_01 = b->coefficients_;
    if (b_01 == (Coefficients *)0x0) {
      b_01 = (Coefficients *)&_Coefficients_default_instance_;
    }
    bVar1 = operator!=(a_01,b_01);
    if (!bVar1) {
      if (((a->rho_ == b->rho_) && (!NAN(a->rho_) && !NAN(b->rho_))) && (a->_oneof_case_[0] != 0)) {
        if (a->_oneof_case_[0] == 3) {
          pDVar2 = SupportVectorRegressor::densesupportvectors(a);
          pDVar3 = SupportVectorRegressor::densesupportvectors(b);
          bVar1 = operator==(&pDVar2->vectors_,&pDVar3->vectors_);
          return bVar1;
        }
        pSVar4 = SupportVectorRegressor::sparsesupportvectors(a);
        pSVar5 = SupportVectorRegressor::sparsesupportvectors(b);
        bVar1 = operator==(&pSVar4->vectors_,&pSVar5->vectors_);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const SupportVectorRegressor& a,
                        const SupportVectorRegressor& b) {
            if (a.kernel() != b.kernel()) {
                return false;
            }
            if (a.supportVectors_case() != b.supportVectors_case()) {
                return false;
            }
            if (a.coefficients() != b.coefficients()) {
                return false;
            }
            if (a.rho() != b.rho()) {
                return false;
            }
            switch (a.supportVectors_case()) {
                case SupportVectorRegressor::kSparseSupportVectors:
                    return a.sparsesupportvectors().vectors() == b.sparsesupportvectors().vectors();
                case SupportVectorRegressor::kDenseSupportVectors:
                    return a.densesupportvectors().vectors() == b.densesupportvectors().vectors();
                case SupportVectorRegressor::SUPPORTVECTORS_NOT_SET:
                    return false;
            }
        }